

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

void __thiscall
entityx::EntityManager::ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::next
          (ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> *this)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = this->i_;
  while( true ) {
    if (this->capacity_ <= (ulong)uVar2) {
      return;
    }
    bVar1 = predicate(this);
    if (bVar1) break;
    uVar2 = this->i_ + 1;
    this->i_ = uVar2;
  }
  return;
}

Assistant:

void next() {
      while (i_ < capacity_ && !predicate()) {
        ++i_;
      }

      if (i_ < capacity_) {
        Entity entity = manager_->get(manager_->create_id(i_));
        static_cast<Delegate*>(this)->next_entity(entity);
      }
    }